

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.hh
# Opt level: O2

void __thiscall avro::json::JsonGenerator::encodeNumber<int>(JsonGenerator *this,int t)

{
  ostringstream oss;
  uint8_t *local_1b0;
  size_t local_1a8;
  ostringstream local_190 [376];
  
  sep(this);
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::operator<<(local_190,t);
  std::__cxx11::stringbuf::str();
  StreamWriter::writeBytes(&this->out_,local_1b0,local_1a8);
  if (this->top == stKey) {
    this->top = stMapN;
  }
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void encodeNumber(T t) {
        sep();
        std::ostringstream oss;
        oss << t;
        const std::string& s = oss.str();
        out_.writeBytes(reinterpret_cast<const uint8_t*>(&s[0]), s.size());
        sep2();
    }